

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

MPLSStreamInfo * __thiscall
MPLSParser::getStreamByPID(MPLSStreamInfo *__return_storage_ptr__,MPLSParser *this,int pid)

{
  pointer other;
  
  other = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
          _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (other == (this->m_streamInfo).
                 super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      MPLSStreamInfo::MPLSStreamInfo(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if ((other->super_M2TSStreamInfo).streamPID == pid) break;
    other = other + 1;
  }
  MPLSStreamInfo::MPLSStreamInfo(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

MPLSStreamInfo MPLSParser::getStreamByPID(const int pid) const
{
    for (auto& i : m_streamInfo)
    {
        if (i.streamPID == pid)
            return i;
    }
    return {};
}